

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::sendReference(PSVIWriterHandlers *this,XMLCh *elementName,XSObject *obj)

{
  BaseRefVectorOf<char16_t> *pBVar1;
  XMLSize_t XVar2;
  XMLCh *pXVar3;
  
  if (obj != (XSObject *)0x0) {
    (*(this->fAttrList->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[3])();
    pBVar1 = &this->fAttrList->super_BaseRefVectorOf<char16_t>;
    xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(pBVar1,1);
    XVar2 = pBVar1->fCurCount;
    pBVar1->fElemList[XVar2] = L"ref";
    pBVar1->fCurCount = XVar2 + 1;
    pBVar1 = &this->fAttrList->super_BaseRefVectorOf<char16_t>;
    pXVar3 = getIdName(this,obj);
    xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(pBVar1,1);
    XVar2 = pBVar1->fCurCount;
    pBVar1->fElemList[XVar2] = pXVar3;
    pBVar1->fCurCount = XVar2 + 1;
    pBVar1 = &this->fAttrList->super_BaseRefVectorOf<char16_t>;
    xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(pBVar1,1);
    XVar2 = pBVar1->fCurCount;
    pBVar1->fElemList[XVar2] = L"xsi:nil";
    pBVar1->fCurCount = XVar2 + 1;
    pBVar1 = &this->fAttrList->super_BaseRefVectorOf<char16_t>;
    xercesc_4_0::BaseRefVectorOf<char16_t>::ensureExtraCapacity(pBVar1,1);
    XVar2 = pBVar1->fCurCount;
    pBVar1->fElemList[XVar2] = (char16_t *)&xercesc_4_0::PSVIUni::fgTrue;
    pBVar1->fCurCount = XVar2 + 1;
    writeEmpty(this,elementName,this->fAttrList);
    return;
  }
  sendElementEmpty(this,elementName);
  return;
}

Assistant:

void PSVIWriterHandlers::sendReference(const XMLCh* elementName, XSObject* obj) {
	if (obj==NULL) {
		sendElementEmpty(elementName);
	} else {
		fAttrList->removeAllElements();
		fAttrList->addElement((XMLCh*)gRef);
		fAttrList->addElement((XMLCh*)getIdName(obj));
		fAttrList->addElement((XMLCh*)fgXsiNil);
		fAttrList->addElement((XMLCh*)PSVIUni::fgTrue);
		writeEmpty(elementName, fAttrList);
	}
}